

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::Arena::AddBlock(Arena *this,Block *b)

{
  MutexLock local_20;
  MutexLock l;
  Block *b_local;
  Arena *this_local;
  
  l.mu_ = (Mutex *)b;
  internal::MutexLock::MutexLock(&local_20,(Mutex *)(this + 0x30));
  AddBlockInternal(this,(Block *)l.mu_);
  internal::MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

void Arena::AddBlock(Block* b) {
  MutexLock l(&blocks_lock_);
  AddBlockInternal(b);
}